

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFile.cc
# Opt level: O3

ostream * avro::operator<<(ostream *os,DataFileSync *s)

{
  char cVar1;
  undefined8 in_RAX;
  ostream *poVar2;
  byte bVar3;
  size_t i;
  long lVar4;
  undefined8 uStack_38;
  
  lVar4 = 0;
  uStack_38 = in_RAX;
  do {
    cVar1 = 'W';
    if (s->elems[lVar4] < 0xa0) {
      cVar1 = '0';
    }
    uStack_38._0_6_ = CONCAT15(cVar1 + (s->elems[lVar4] >> 4),(undefined5)uStack_38);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)((long)&uStack_38 + 5),1)
    ;
    bVar3 = s->elems[lVar4] & 0xf;
    cVar1 = 'W';
    if (bVar3 < 10) {
      cVar1 = '0';
    }
    uStack_38._0_7_ = CONCAT16(cVar1 + bVar3,(undefined6)uStack_38);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(char *)((long)&uStack_38 + 6),1);
    uStack_38 = CONCAT17(0x20,(undefined7)uStack_38);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)((long)&uStack_38 + 7),1);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x10);
  std::ios::widen((char)os->_vptr_basic_ostream[-3] + (char)os);
  std::ostream::put((char)os);
  std::ostream::flush();
  return os;
}

Assistant:

std::ostream& operator << (std::ostream& os, const DataFileSync& s)
{
    for (size_t i = 0; i < s.size(); ++i) {
        os << hex(s[i] / 16)  << hex(s[i] % 16) << ' ';
    }
    os << std::endl;
    return os;
}